

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O3

wchar_t process_head_file_extra(archive_read *a,archive_entry *e,rar5 *rar,int64_t extra_data_size)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  archive_entry *paVar4;
  uint32_t *pvalue;
  char cVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  char *pcVar10;
  undefined8 *puVar11;
  int64_t iVar12;
  void *pvVar13;
  char *pcVar14;
  char *pcVar15;
  int error_number;
  long lVar16;
  byte bVar17;
  uint64_t value_size_1;
  uint64_t value_size;
  uint64_t flags;
  uint64_t id;
  uint64_t var_size;
  uint64_t extra_field_id;
  uint64_t extra_field_size;
  uint64_t v;
  long local_20e0;
  archive_entry *local_20d8;
  uint64_t local_20d0;
  archive_string local_20c8;
  uint64_t local_20b0;
  uint32_t *local_20a8;
  uint32_t *local_20a0;
  uint64_t local_2098;
  int64_t *local_2090;
  int64_t *local_2088;
  int64_t *local_2080;
  uint64_t *local_2078;
  uint64_t *local_2070;
  rar5 *local_2068;
  uint64_t local_2060;
  uint64_t local_2058;
  uint64_t local_2050;
  uint8_t *local_2048;
  uint32_t *local_2040;
  archive_string local_2038 [341];
  
  local_2058 = 0;
  if (extra_data_size < 1) {
    wVar7 = L'\xffffffe2';
  }
  else {
    local_2070 = &(rar->file).redir_type;
    local_2078 = &(rar->file).redir_flags;
    local_2040 = &(rar->file).e_mtime_ns;
    local_20a0 = &(rar->file).e_ctime_ns;
    local_20a8 = &(rar->file).e_atime_ns;
    local_2080 = &(rar->file).e_mtime;
    local_2088 = &(rar->file).e_ctime;
    local_2090 = &(rar->file).e_atime;
    local_2048 = (rar->file).blake2sp;
    wVar7 = L'\xffffffe2';
    local_20d8 = e;
    local_2068 = rar;
    do {
      wVar6 = read_var(a,&local_2050,&local_2060);
      uVar9 = local_2060;
      if (wVar6 == L'\0') {
        return L'\x01';
      }
      uVar8 = __archive_read_consume(a,local_2060);
      if (uVar8 != uVar9) {
        return L'\x01';
      }
      wVar6 = read_var(a,&local_2058,&local_2060);
      uVar8 = local_2060;
      if (wVar6 == L'\0') {
        return L'\x01';
      }
      local_2050 = local_2050 - local_2060;
      lVar16 = extra_data_size - (uVar9 + local_2060);
      local_20e0 = lVar16;
      uVar9 = __archive_read_consume(a,local_2060);
      if (uVar9 != uVar8) {
        return L'\x01';
      }
      switch(local_2058) {
      case 1:
        archive_entry_set_is_data_encrypted(local_20d8,'\x01');
        local_2068->has_encrypted_entries = L'\x01';
        *(byte *)&local_2068->cstate = *(byte *)&local_2068->cstate | 0x10;
      default:
        uVar9 = local_2050;
        extra_data_size = lVar16 - local_2050;
        local_20e0 = extra_data_size;
        uVar8 = __archive_read_consume(a,local_2050);
        if (uVar8 != uVar9) {
          return L'\x01';
        }
        break;
      case 2:
        local_20c8.s = (char *)0x0;
        wVar7 = read_var(a,(uint64_t *)local_2038,(uint64_t *)&local_20c8);
        pcVar14 = local_2038[0].s;
        pcVar15 = local_20c8.s;
        if (wVar7 == L'\0') {
LAB_0012d806:
          wVar7 = L'\x01';
          extra_data_size = local_20e0;
        }
        else {
          lVar16 = lVar16 - (long)local_20c8.s;
          local_20e0 = lVar16;
          pcVar10 = (char *)__archive_read_consume(a,(int64_t)local_20c8.s);
          extra_data_size = lVar16;
          wVar7 = L'\x01';
          if (pcVar10 == pcVar15) {
            if (pcVar14 == (char *)0x0) {
              local_2038[0].s = (char *)0xffffffffffffffff;
              puVar11 = (undefined8 *)__archive_read_ahead(a,0x20,(ssize_t *)local_2038);
              wVar7 = L'\x01';
              extra_data_size = local_20e0;
              if (puVar11 != (undefined8 *)0x0) {
                (local_2068->file).has_blake2 = '\x01';
                uVar1 = *puVar11;
                uVar2 = puVar11[1];
                uVar3 = puVar11[3];
                *(undefined8 *)(local_2048 + 0x10) = puVar11[2];
                *(undefined8 *)(local_2048 + 0x18) = uVar3;
                *(undefined8 *)local_2048 = uVar1;
                *(undefined8 *)(local_2048 + 8) = uVar2;
                iVar12 = __archive_read_consume(a,0x20);
                extra_data_size = local_20e0;
                if (iVar12 == 0x20) {
                  local_20e0 = lVar16 + -0x20;
                  extra_data_size = local_20e0;
                  wVar7 = L'\0';
                }
              }
            }
            else {
              archive_set_error(&a->archive,0x54,"Unsupported hash type (0x%jx)",pcVar14);
LAB_0012daaa:
              extra_data_size = local_20e0;
              wVar7 = L'\xffffffe2';
            }
          }
        }
        break;
      case 3:
        local_20c8.s = (char *)0x0;
        wVar7 = read_var(a,(uint64_t *)local_2038,(uint64_t *)&local_20c8);
        pcVar14 = local_2038[0].s;
        pcVar15 = local_20c8.s;
        if (wVar7 == L'\0') goto LAB_0012d806;
        extra_data_size = lVar16 - (long)local_20c8.s;
        local_20e0 = extra_data_size;
        pcVar10 = (char *)__archive_read_consume(a,(int64_t)local_20c8.s);
        pvalue = local_2040;
        wVar7 = L'\x01';
        if (pcVar10 == pcVar15) {
          bVar17 = (byte)pcVar14 & 1;
          *local_2040 = 0;
          *local_20a0 = 0;
          *local_20a8 = 0;
          if (((ulong)pcVar14 & 2) != 0) {
            parse_htime_item(a,bVar17,local_2080,local_2040,&local_20e0);
          }
          if (((ulong)pcVar14 & 4) != 0) {
            parse_htime_item(a,bVar17,local_2088,local_20a0,&local_20e0);
          }
          if (((ulong)pcVar14 & 8) != 0) {
            parse_htime_item(a,bVar17,local_2090,local_20a8,&local_20e0);
          }
          bVar17 = (byte)(((uint)pcVar14 & 0x10) >> 4) & (byte)pcVar14 ^ 1;
          if (((ulong)pcVar14 & 2) != 0 && bVar17 == 0) {
            cVar5 = read_u32(a,pvalue);
            if (cVar5 == '\0') goto LAB_0012d806;
            local_20e0 = local_20e0 + -4;
          }
          if (((ulong)pcVar14 & 4) != 0 && bVar17 == 0) {
            cVar5 = read_u32(a,local_20a0);
            if (cVar5 == '\0') goto LAB_0012d806;
            local_20e0 = local_20e0 + -4;
          }
          if (((ulong)pcVar14 & 8) != 0 && bVar17 == 0) {
            cVar5 = read_u32(a,local_20a8);
            if (cVar5 == '\0') goto LAB_0012d806;
            local_20e0 = local_20e0 + -4;
          }
          if (((ulong)pcVar14 & 2) != 0) {
            archive_entry_set_mtime(local_20d8,*local_2080,(ulong)*pvalue);
          }
          if (((ulong)pcVar14 & 4) != 0) {
            archive_entry_set_ctime(local_20d8,*local_2088,(ulong)*local_20a0);
          }
          wVar7 = L'\0';
          extra_data_size = local_20e0;
          if (((ulong)pcVar14 & 8) != 0) {
            archive_entry_set_atime(local_20d8,*local_2090,(ulong)*local_20a8);
            extra_data_size = local_20e0;
          }
        }
        break;
      case 4:
        local_20c8.s = (char *)0x0;
        wVar6 = read_var(a,(uint64_t *)local_2038,(uint64_t *)&local_20c8);
        pcVar15 = local_20c8.s;
        wVar7 = L'\x01';
        extra_data_size = local_20e0;
        if (wVar6 != L'\0') {
          lVar16 = lVar16 - (long)local_20c8.s;
          local_20e0 = lVar16;
          pcVar14 = (char *)__archive_read_consume(a,(int64_t)local_20c8.s);
          extra_data_size = local_20e0;
          if (pcVar14 == pcVar15) {
            local_20c8.s = (char *)0x0;
            wVar6 = read_var(a,(uint64_t *)local_2038,(uint64_t *)&local_20c8);
            pcVar14 = local_2038[0].s;
            pcVar15 = local_20c8.s;
            extra_data_size = local_20e0;
            if (wVar6 != L'\0') {
              local_20e0 = lVar16 - (long)local_20c8.s;
              pcVar10 = (char *)__archive_read_consume(a,(int64_t)local_20c8.s);
              paVar4 = local_20d8;
              extra_data_size = local_20e0;
              if (pcVar10 == pcVar15) {
                pcVar15 = archive_entry_pathname_utf8(local_20d8);
                if (pcVar15 == (char *)0x0) {
                  error_number = 0x16;
                  pcVar15 = "Version entry without file name";
                  goto LAB_0012daa3;
                }
                local_2038[0].s = (char *)0x0;
                local_2038[0].length = 0;
                wVar7 = L'\0';
                local_2038[0].buffer_length = 0;
                local_20c8.s = (char *)0x0;
                local_20c8.length = 0;
                local_20c8.buffer_length = 0;
                archive_string_sprintf(local_2038,";%zu",pcVar14);
                archive_strcat(&local_20c8,pcVar15);
                archive_strcat(&local_20c8,local_2038[0].s);
                archive_entry_update_pathname_utf8(paVar4,local_20c8.s);
                archive_string_free(local_2038);
                archive_string_free(&local_20c8);
                extra_data_size = local_20e0;
              }
            }
          }
        }
        break;
      case 5:
        local_20c8.s = (char *)0x0;
        wVar6 = read_var(a,local_2070,(uint64_t *)&local_20c8);
        pcVar15 = local_20c8.s;
        wVar7 = L'\x01';
        extra_data_size = local_20e0;
        if ((wVar6 != L'\0') &&
           (pcVar14 = (char *)__archive_read_consume(a,(int64_t)local_20c8.s),
           extra_data_size = local_20e0, pcVar14 == pcVar15)) {
          lVar16 = lVar16 - (long)local_20c8.s;
          local_20e0 = lVar16;
          wVar6 = read_var(a,local_2078,(uint64_t *)&local_20c8);
          pcVar15 = local_20c8.s;
          extra_data_size = local_20e0;
          if ((wVar6 != L'\0') &&
             (pcVar14 = (char *)__archive_read_consume(a,(int64_t)local_20c8.s),
             extra_data_size = local_20e0, pcVar14 == pcVar15)) {
            lVar16 = lVar16 - (long)local_20c8.s;
            local_20e0 = lVar16;
            wVar6 = read_var(a,(uint64_t *)local_2038,(uint64_t *)0x0);
            pcVar15 = local_2038[0].s;
            extra_data_size = local_20e0;
            if (wVar6 != L'\0') {
              local_20e0 = lVar16 + ~(ulong)local_2038[0].s;
              if (local_2038[0].s < (char *)0x800) {
                if (local_2038[0].s != (char *)0x0) {
                  local_2038[0].s = (char *)0xffffffffffffffff;
                  pvVar13 = __archive_read_ahead(a,(size_t)pcVar15,(ssize_t *)local_2038);
                  extra_data_size = local_20e0;
                  if (pvVar13 != (void *)0x0) {
                    memcpy(local_2038,pvVar13,(size_t)pcVar15);
                    pcVar15[(long)&local_2038[0].s] = '\0';
                    pcVar14 = (char *)__archive_read_consume(a,(int64_t)pcVar15);
                    paVar4 = local_20d8;
                    extra_data_size = local_20e0;
                    if (pcVar14 == pcVar15) {
                      wVar7 = L'\0';
                      if (*local_2070 - 1 < 2) {
                        archive_entry_set_filetype(local_20d8,0xa000);
                        archive_entry_update_symlink_utf8(paVar4,(char *)local_2038);
                        if ((*local_2078 & 1) == 0) {
                          wVar6 = L'\x01';
                        }
                        else {
                          wVar6 = L'\x02';
                        }
                        archive_entry_set_symlink_type(paVar4,wVar6);
                        extra_data_size = local_20e0;
                      }
                      else if (*local_2070 == 4) {
                        archive_entry_set_filetype(local_20d8,0x8000);
                        archive_entry_update_hardlink_utf8(paVar4,(char *)local_2038);
                        extra_data_size = local_20e0;
                        wVar7 = L'\0';
                      }
                    }
                  }
                  break;
                }
                error_number = 0x54;
                pcVar15 = "No link target specified";
              }
              else {
                error_number = 0x54;
                pcVar15 = "Link target is too long";
              }
LAB_0012daa3:
              archive_set_error(&a->archive,error_number,pcVar15);
              goto LAB_0012daaa;
            }
          }
        }
        break;
      case 6:
        local_20b0 = 0;
        local_20d0 = 0;
        local_2098 = 0;
        wVar6 = read_var(a,&local_20b0,&local_20d0);
        uVar9 = local_20d0;
        wVar7 = L'\x01';
        extra_data_size = local_20e0;
        if ((wVar6 != L'\0') &&
           (uVar8 = __archive_read_consume(a,local_20d0), extra_data_size = local_20e0,
           uVar8 == uVar9)) {
          lVar16 = lVar16 - local_20d0;
          local_20e0 = lVar16;
          if ((local_20b0 & 1) == 0) {
LAB_0012d74c:
            if ((local_20b0 & 2) == 0) {
LAB_0012d759:
              if ((local_20b0 & 4) != 0) {
                wVar6 = read_var(a,&local_2098,&local_20d0);
                uVar9 = local_20d0;
                extra_data_size = local_20e0;
                if ((wVar6 == L'\0') ||
                   (uVar8 = __archive_read_consume(a,local_20d0), extra_data_size = local_20e0,
                   uVar8 != uVar9)) break;
                lVar16 = lVar16 - local_20d0;
                local_20e0 = lVar16;
                archive_entry_set_uid(local_20d8,local_2098);
              }
              if ((local_20b0 & 8) != 0) {
                wVar6 = read_var(a,&local_2098,&local_20d0);
                uVar9 = local_20d0;
                extra_data_size = local_20e0;
                if ((wVar6 == L'\0') ||
                   (uVar8 = __archive_read_consume(a,local_20d0), extra_data_size = local_20e0,
                   uVar8 != uVar9)) break;
                local_20e0 = lVar16 - local_20d0;
                archive_entry_set_gid(local_20d8,local_2098);
              }
              extra_data_size = local_20e0;
              wVar7 = L'\0';
            }
            else {
              wVar6 = read_var(a,(uint64_t *)&local_20c8,(uint64_t *)0x0);
              pcVar15 = local_20c8.s;
              extra_data_size = local_20e0;
              if (wVar6 != L'\0') {
                lVar16 = lVar16 + ~(ulong)local_20c8.s;
                local_20c8.s = (char *)0xffffffffffffffff;
                local_20e0 = lVar16;
                pvVar13 = __archive_read_ahead(a,(size_t)pcVar15,(ssize_t *)&local_20c8);
                extra_data_size = local_20e0;
                if (pvVar13 != (void *)0x0) {
                  pcVar14 = (char *)0xff;
                  if (pcVar15 < (char *)0xff) {
                    pcVar14 = pcVar15;
                  }
                  memcpy(local_2038,pvVar13,(size_t)pcVar14);
                  pcVar14[(long)&local_2038[0].s] = '\0';
                  pcVar14 = (char *)__archive_read_consume(a,(int64_t)pcVar15);
                  extra_data_size = local_20e0;
                  if (pcVar14 == pcVar15) {
                    archive_entry_set_gname(local_20d8,(char *)local_2038);
                    goto LAB_0012d759;
                  }
                }
              }
            }
          }
          else {
            wVar6 = read_var(a,(uint64_t *)local_2038,(uint64_t *)0x0);
            pcVar15 = local_2038[0].s;
            extra_data_size = local_20e0;
            if (wVar6 != L'\0') {
              lVar16 = lVar16 + ~(ulong)local_2038[0].s;
              local_2038[0].s = (char *)0xffffffffffffffff;
              local_20e0 = lVar16;
              pvVar13 = __archive_read_ahead(a,(size_t)pcVar15,(ssize_t *)local_2038);
              extra_data_size = local_20e0;
              if (pvVar13 != (void *)0x0) {
                pcVar14 = (char *)0xff;
                if (pcVar15 < (char *)0xff) {
                  pcVar14 = pcVar15;
                }
                memcpy(local_2038,pvVar13,(size_t)pcVar14);
                pcVar14[(long)&local_2038[0].s] = '\0';
                pcVar14 = (char *)__archive_read_consume(a,(int64_t)pcVar15);
                extra_data_size = local_20e0;
                if (pcVar14 == pcVar15) {
                  archive_entry_set_uname(local_20d8,(char *)local_2038);
                  goto LAB_0012d74c;
                }
              }
            }
          }
        }
      }
    } while (0 < extra_data_size);
  }
  return wVar7;
}

Assistant:

static int process_head_file_extra(struct archive_read* a,
    struct archive_entry* e, struct rar5* rar, int64_t extra_data_size)
{
	uint64_t extra_field_size;
	uint64_t extra_field_id = 0;
	int ret = ARCHIVE_FATAL;
	uint64_t var_size;

	while(extra_data_size > 0) {
		if(!read_var(a, &extra_field_size, &var_size))
			return ARCHIVE_EOF;

		extra_data_size -= var_size;
		if(ARCHIVE_OK != consume(a, var_size)) {
			return ARCHIVE_EOF;
		}

		if(!read_var(a, &extra_field_id, &var_size))
			return ARCHIVE_EOF;

		extra_field_size -= var_size;
		extra_data_size -= var_size;
		if(ARCHIVE_OK != consume(a, var_size)) {
			return ARCHIVE_EOF;
		}

		switch(extra_field_id) {
			case EX_HASH:
				ret = parse_file_extra_hash(a, rar,
				    &extra_data_size);
				break;
			case EX_HTIME:
				ret = parse_file_extra_htime(a, e, rar,
				    &extra_data_size);
				break;
			case EX_REDIR:
				ret = parse_file_extra_redir(a, e, rar,
				    &extra_data_size);
				break;
			case EX_UOWNER:
				ret = parse_file_extra_owner(a, e,
				    &extra_data_size);
				break;
			case EX_VERSION:
				ret = parse_file_extra_version(a, e,
				    &extra_data_size);
				break;
			case EX_CRYPT:
				/* Mark the entry as encrypted */
				archive_entry_set_is_data_encrypted(e, 1);
				rar->has_encrypted_entries = 1;
				rar->cstate.data_encrypted = 1;
				/* fallthrough */
			case EX_SUBDATA:
				/* fallthrough */
			default:
				/* Skip unsupported entry. */
				extra_data_size -= extra_field_size;
				if (ARCHIVE_OK != consume(a, extra_field_size)) {
					return ARCHIVE_EOF;
				}
		}
	}

	if(ret != ARCHIVE_OK) {
		/* Attribute not implemented. */
		return ret;
	}

	return ARCHIVE_OK;
}